

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O2

void uv__write_callbacks(uv_stream_t *stream)

{
  uv_write_t *req;
  uint uVar1;
  long *plVar2;
  long lVar3;
  size_t sVar4;
  QUEUE *q;
  QUEUE pq;
  long *local_38;
  void *local_30;
  
  local_38 = (long *)stream->write_completed_queue[0];
  if (stream->write_completed_queue != (void **)local_38) {
    local_30 = stream->write_completed_queue[1];
    *(long ***)local_30 = &local_38;
    plVar2 = (long *)local_38[1];
    stream->write_completed_queue[1] = plVar2;
    *plVar2 = (long)stream->write_completed_queue;
    local_38[1] = (long)&local_38;
    while (plVar2 = local_38, &local_38 != (long **)local_38) {
      lVar3 = *local_38;
      *(long *)local_38[1] = lVar3;
      *(long *)(lVar3 + 8) = local_38[1];
      uVar1 = (stream->loop->active_reqs).count;
      if (uVar1 == 0) {
        __assert_fail("uv__has_active_reqs(stream->loop)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/stream.c"
                      ,0x3ae,"void uv__write_callbacks(uv_stream_t *)");
      }
      req = (uv_write_t *)(local_38 + -0xb);
      (stream->loop->active_reqs).count = uVar1 - 1;
      if (local_38[3] != 0) {
        sVar4 = uv__write_req_size(req);
        stream->write_queue_size = stream->write_queue_size - sVar4;
        if ((long *)plVar2[3] != plVar2 + 5) {
          uv__free((long *)plVar2[3]);
        }
        plVar2[3] = 0;
      }
      if ((code *)plVar2[-3] != (code *)0x0) {
        (*(code *)plVar2[-3])(req,*(undefined4 *)((long)plVar2 + 0x24));
      }
    }
  }
  return;
}

Assistant:

static void uv__write_callbacks(uv_stream_t* stream) {
  uv_write_t* req;
  QUEUE* q;
  QUEUE pq;

  if (QUEUE_EMPTY(&stream->write_completed_queue))
    return;

  QUEUE_MOVE(&stream->write_completed_queue, &pq);

  while (!QUEUE_EMPTY(&pq)) {
    /* Pop a req off write_completed_queue. */
    q = QUEUE_HEAD(&pq);
    req = QUEUE_DATA(q, uv_write_t, queue);
    QUEUE_REMOVE(q);
    uv__req_unregister(stream->loop, req);

    if (req->bufs != NULL) {
      stream->write_queue_size -= uv__write_req_size(req);
      if (req->bufs != req->bufsml)
        uv__free(req->bufs);
      req->bufs = NULL;
    }

    /* NOTE: call callback AFTER freeing the request data. */
    if (req->cb)
      req->cb(req, req->error);
  }
}